

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChElementShellANCF_3423.cpp
# Opt level: O1

void __thiscall
chrono::fea::ChElementShellANCF_3423::EvaluateSectionFrame
          (ChElementShellANCF_3423 *this,double u,double v,ChVector<double> *point,
          ChQuaternion<double> *rot)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  bool bVar4;
  char cVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  double dVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  double dVar32;
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  double dVar36;
  double dVar37;
  undefined1 auVar38 [16];
  double dVar39;
  double dVar40;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  double dVar44;
  undefined1 auVar45 [16];
  ChVector<double> MidsurfaceY;
  ChVector<double> MidsurfaceX;
  ShapeVector Ny;
  ShapeVector Nx;
  MatrixNx3 e_bar;
  ChVector<double> local_200;
  ChMatrixNM<double,_8,_3> *local_1e8;
  double *local_1e0;
  ChVector<double> local_1d8;
  double local_1c0;
  double local_1b8;
  double local_1b0;
  double local_1a8;
  double local_1a0;
  double local_198;
  double local_190;
  double local_188;
  double local_180;
  double local_178;
  double local_170;
  double local_168;
  double local_160;
  double local_158;
  double local_150;
  double local_148;
  ChMatrixNM<double,_8,_3> local_140;
  
  (*(this->super_ChElementShell).super_ChElementGeneric.super_ChElementBase._vptr_ChElementBase
    [0x18])();
  CalcCoordMatrix(this,&local_140);
  dVar24 = -2.0 / this->m_lenX;
  local_150 = dVar24 * 0.25;
  local_168 = 1.0 - v;
  local_180 = local_168 * local_150;
  local_200.m_data[1] = (double)&local_180;
  local_198 = this->m_thickness * 0.0 * 0.5 * 0.25;
  dVar24 = dVar24 * local_198;
  local_178 = local_168 * dVar24;
  local_158 = 2.0 / this->m_lenX;
  local_160 = local_158 * 0.25;
  local_170 = local_160 * local_168;
  local_158 = local_158 * local_198;
  local_168 = local_168 * local_158;
  local_148 = v + 1.0;
  local_160 = local_160 * local_148;
  local_158 = local_148 * local_158;
  local_150 = local_148 * local_150;
  local_148 = local_148 * dVar24;
  local_190 = (1.0 - u) * 0.25;
  local_1a8 = -2.0 / this->m_lenY;
  local_1c0 = local_190 * local_1a8;
  local_188 = (1.0 - u) * local_198;
  local_1b8 = local_188 * local_1a8;
  local_1a0 = (u + 1.0) * 0.25;
  local_1b0 = local_1a0 * local_1a8;
  local_198 = (u + 1.0) * local_198;
  local_1a8 = local_198 * local_1a8;
  dVar24 = 2.0 / this->m_lenY;
  local_1a0 = local_1a0 * dVar24;
  local_198 = local_198 * dVar24;
  local_190 = local_190 * dVar24;
  local_188 = local_188 * dVar24;
  local_200.m_data[0] = (double)&local_140;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            (&local_1d8,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)&local_200,(type *)0x0);
  local_1e8 = &local_140;
  local_1e0 = &local_1c0;
  ChVector<double>::
  ChVector<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,8,3,1,8,3>>,Eigen::Transpose<Eigen::Matrix<double,1,8,1,1,8>>,0>>
            (&local_200,
             (MatrixBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_8,_3,_1,_8,_3>_>,_Eigen::Transpose<Eigen::Matrix<double,_1,_8,_1,_1,_8>_>,_0>_>
              *)&local_1e8,(type *)0x0);
  auVar38 = ZEXT816(0x3ff0000000000000);
  auVar7 = ZEXT816(0) << 0x40;
  auVar8._8_8_ = 0;
  auVar8._0_8_ = local_1d8.m_data[0];
  auVar28._8_8_ = 0;
  auVar28._0_8_ = local_1d8.m_data[2];
  if ((((local_1d8.m_data[0] != 0.0) || (NAN(local_1d8.m_data[0]))) || (local_1d8.m_data[1] != 0.0))
     || (NAN(local_1d8.m_data[1]))) {
LAB_007512be:
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_1d8.m_data[1] * local_1d8.m_data[1];
    auVar7 = vfmadd231sd_fma(auVar12,auVar8,auVar8);
    auVar7 = vfmadd231sd_fma(auVar7,auVar28,auVar28);
    if (auVar7._0_8_ < 0.0) {
      dVar24 = sqrt(auVar7._0_8_);
    }
    else {
      auVar7 = vsqrtsd_avx(auVar7,auVar7);
      dVar24 = auVar7._0_8_;
    }
    bVar4 = 2.2250738585072014e-308 <= dVar24;
    dVar24 = 1.0 / dVar24;
    auVar6._8_8_ = 0;
    auVar6._0_8_ = (ulong)bVar4 * (long)(local_1d8.m_data[1] * dVar24);
    auVar38._8_8_ = 0;
    auVar38._0_8_ =
         (ulong)bVar4 * (long)(local_1d8.m_data[0] * dVar24) + (ulong)!bVar4 * 0x3ff0000000000000;
    auVar7._8_8_ = 0;
    auVar7._0_8_ = (ulong)bVar4 * (long)(local_1d8.m_data[2] * dVar24);
  }
  else {
    auVar6 = ZEXT816(0) << 0x40;
    if ((local_1d8.m_data[2] != 0.0) || (NAN(local_1d8.m_data[2]))) goto LAB_007512be;
  }
  auVar13._8_8_ = 0;
  auVar13._0_8_ = local_200.m_data[2];
  auVar21._8_8_ = 0;
  auVar21._0_8_ = local_200.m_data[0];
  auVar25._8_8_ = 0;
  auVar25._0_8_ = local_200.m_data[1];
  dVar36 = auVar7._0_8_;
  auVar26._8_8_ = 0;
  auVar26._0_8_ = local_200.m_data[1] * dVar36;
  auVar8 = vfmsub231sd_fma(auVar26,auVar6,auVar13);
  dVar24 = auVar8._0_8_;
  dVar37 = auVar38._0_8_;
  auVar41._8_8_ = 0;
  auVar41._0_8_ = dVar37 * local_200.m_data[2];
  auVar28 = vfmsub231sd_fma(auVar41,auVar7,auVar21);
  dVar39 = auVar6._0_8_;
  auVar33._8_8_ = 0;
  auVar33._0_8_ = dVar39 * local_200.m_data[0];
  auVar12 = vfmsub231sd_fma(auVar33,auVar38,auVar25);
  dVar10 = auVar12._0_8_;
  dVar40 = auVar28._0_8_;
  auVar14._8_8_ = 0;
  auVar14._0_8_ = dVar40 * dVar40;
  auVar8 = vfmadd231sd_fma(auVar14,auVar8,auVar8);
  auVar8 = vfmadd231sd_fma(auVar8,auVar12,auVar12);
  if (auVar8._0_8_ < 0.0) {
    dVar9 = sqrt(auVar8._0_8_);
  }
  else {
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    dVar9 = auVar8._0_8_;
  }
  if (0.0001 <= dVar9) goto LAB_0075150a;
  auVar22._8_8_ = 0;
  auVar22._0_8_ = local_200.m_data[0];
  auVar1._8_8_ = 0x7fffffffffffffff;
  auVar1._0_8_ = 0x7fffffffffffffff;
  auVar8 = vandpd_avx512vl(auVar22,auVar1);
  if (0.9 <= auVar8._0_8_) {
    auVar29._8_8_ = 0;
    auVar29._0_8_ = local_200.m_data[1];
    auVar2._8_8_ = 0x7fffffffffffffff;
    auVar2._0_8_ = 0x7fffffffffffffff;
    auVar8 = vandpd_avx512vl(auVar29,auVar2);
    if (0.9 <= auVar8._0_8_) {
      auVar30._8_8_ = 0;
      auVar30._0_8_ = local_200.m_data[2];
      auVar3._8_8_ = 0x7fffffffffffffff;
      auVar3._0_8_ = 0x7fffffffffffffff;
      auVar8 = vandpd_avx512vl(auVar30,auVar3);
      auVar28 = ZEXT816(0);
      if (0.9 <= auVar8._0_8_) goto LAB_0075148b;
      auVar8 = ZEXT816(0x3ff0000000000000);
    }
    else {
      auVar28 = ZEXT816(0x3ff0000000000000);
LAB_0075148b:
      auVar8 = ZEXT816(0);
    }
    auVar12 = ZEXT816(0) << 0x40;
  }
  else {
    auVar12 = ZEXT816(0x3ff0000000000000);
    auVar8 = ZEXT816(0);
    auVar28 = ZEXT816(0) << 0x40;
  }
  auVar27._8_8_ = 0;
  auVar27._0_8_ = auVar28._0_8_ * -dVar36;
  auVar13 = vfmadd231sd_fma(auVar27,auVar6,auVar8);
  dVar24 = auVar13._0_8_;
  auVar42._8_8_ = 0;
  auVar42._0_8_ = auVar8._0_8_ * -dVar37;
  auVar8 = vfmadd231sd_fma(auVar42,auVar7,auVar12);
  dVar40 = auVar8._0_8_;
  auVar34._8_8_ = 0;
  auVar34._0_8_ = auVar12._0_8_ * -dVar39;
  auVar8 = vfmadd231sd_fma(auVar34,auVar38,auVar28);
  dVar10 = auVar8._0_8_;
  auVar15._8_8_ = 0;
  auVar15._0_8_ = dVar40 * dVar40;
  auVar28 = vfmadd231sd_fma(auVar15,auVar13,auVar13);
  auVar8 = vfmadd231sd_fma(auVar28,auVar8,auVar8);
  if (auVar8._0_8_ < 0.0) {
    dVar9 = sqrt(auVar8._0_8_);
  }
  else {
    auVar8 = vsqrtsd_avx(auVar8,auVar8);
    dVar9 = auVar8._0_8_;
  }
LAB_0075150a:
  dVar9 = 1.0 / dVar9;
  dVar24 = dVar24 * dVar9;
  dVar40 = dVar40 * dVar9;
  dVar10 = dVar10 * dVar9;
  auVar35._8_8_ = 0;
  auVar35._0_8_ = dVar39 * dVar10;
  auVar43._8_8_ = 0;
  auVar43._0_8_ = dVar40;
  auVar7 = vfmsub231sd_fma(auVar35,auVar43,auVar7);
  auVar16._8_8_ = 0;
  auVar16._0_8_ = dVar10;
  auVar23._8_8_ = 0;
  auVar23._0_8_ = dVar36 * dVar24;
  auVar8 = vfmsub231sd_fma(auVar23,auVar16,auVar38);
  auVar31._8_8_ = 0;
  auVar31._0_8_ = dVar24;
  auVar45._8_8_ = 0;
  auVar45._0_8_ = dVar37 * dVar40;
  auVar28 = vfmsub231sd_fma(auVar45,auVar31,auVar6);
  dVar11 = auVar8._0_8_;
  dVar9 = dVar10 + dVar37 + dVar11;
  dVar32 = auVar7._0_8_;
  dVar44 = auVar28._0_8_;
  if (0.0 <= dVar9) {
    dVar9 = dVar9 + 1.0;
    if (dVar9 < 0.0) {
      dVar10 = sqrt(dVar9);
    }
    else {
      auVar17._8_8_ = 0;
      auVar17._0_8_ = dVar9;
      auVar7 = vsqrtsd_avx(auVar17,auVar17);
      dVar10 = auVar7._0_8_;
    }
    dVar11 = dVar10 * 0.5;
    dVar10 = 0.5 / dVar10;
    dVar37 = (dVar44 - dVar40) * dVar10;
    dVar9 = (dVar24 - dVar36) * dVar10;
    dVar10 = (dVar39 - dVar32) * dVar10;
  }
  else {
    cVar5 = dVar37 < dVar11;
    dVar9 = dVar37;
    if ((bool)cVar5) {
      dVar9 = dVar11;
    }
    if (dVar9 < dVar10) {
      cVar5 = '\x02';
    }
    if (cVar5 == '\x02') {
      dVar10 = ((dVar10 - dVar37) - dVar11) + 1.0;
      if (dVar10 < 0.0) {
        dVar11 = sqrt(dVar10);
      }
      else {
        auVar19._8_8_ = 0;
        auVar19._0_8_ = dVar10;
        auVar7 = vsqrtsd_avx(auVar19,auVar19);
        dVar11 = auVar7._0_8_;
      }
      dVar10 = dVar11 * 0.5;
      dVar11 = 0.5 / dVar11;
      dVar37 = (dVar36 + dVar24) * dVar11;
      dVar9 = (dVar40 + dVar44) * dVar11;
      dVar24 = dVar39 - dVar32;
    }
    else if (cVar5 == '\x01') {
      dVar10 = ((dVar11 - dVar10) - dVar37) + 1.0;
      if (dVar10 < 0.0) {
        dVar11 = sqrt(dVar10);
      }
      else {
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar10;
        auVar7 = vsqrtsd_avx(auVar18,auVar18);
        dVar11 = auVar7._0_8_;
      }
      dVar9 = dVar11 * 0.5;
      dVar11 = 0.5 / dVar11;
      dVar10 = (dVar40 + dVar44) * dVar11;
      dVar37 = (dVar39 + dVar32) * dVar11;
      dVar24 = dVar24 - dVar36;
    }
    else {
      dVar10 = ((dVar37 - dVar11) - dVar10) + 1.0;
      if (dVar10 < 0.0) {
        dVar11 = sqrt(dVar10);
      }
      else {
        auVar20._8_8_ = 0;
        auVar20._0_8_ = dVar10;
        auVar7 = vsqrtsd_avx(auVar20,auVar20);
        dVar11 = auVar7._0_8_;
      }
      dVar37 = dVar11 * 0.5;
      dVar11 = 0.5 / dVar11;
      dVar9 = (dVar39 + dVar32) * dVar11;
      dVar10 = (dVar36 + dVar24) * dVar11;
      dVar24 = dVar44 - dVar40;
    }
    dVar11 = dVar24 * dVar11;
  }
  rot->m_data[0] = dVar11;
  rot->m_data[1] = dVar37;
  rot->m_data[2] = dVar9;
  rot->m_data[3] = dVar10;
  return;
}

Assistant:

void ChElementShellANCF_3423::EvaluateSectionFrame(const double u,
                                                   const double v,
                                                   ChVector<>& point,
                                                   ChQuaternion<>& rot) {
    // this is not a corotational element, so just do:
    EvaluateSectionPoint(u, v, point);

    MatrixNx3 e_bar;
    CalcCoordMatrix(e_bar);

    ShapeVector Nx;
    ShapeVector Ny;
    ShapeFunctionsDerivativeX(Nx, u, v, 0);
    ShapeFunctionsDerivativeY(Ny, u, v, 0);

    // Since ANCF does not use rotations, calculate an approximate
    // rotation based off the position vector gradients
    ChVector<double> MidsurfaceX = e_bar.transpose() * Nx.transpose();
    ChVector<double> MidsurfaceY = e_bar.transpose() * Ny.transpose();

    // Since the position vector gradients are not in general orthogonal,
    // set the Dx direction tangent to the shell xi axis and
    // compute the Dy and Dz directions by using a
    // Gram-Schmidt orthonormalization, guided by the shell eta axis
    ChMatrix33<> msect;
    msect.Set_A_Xdir(MidsurfaceX, MidsurfaceY);

    rot = msect.Get_A_quaternion();
}